

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall higan::Socket::Socket(Socket *this,InetAddress *address)

{
  int iVar1;
  InetAddress *address_local;
  Socket *this_local;
  
  iVar1 = socket(2,0x80801,0);
  this->fd_ = iVar1;
  InetAddress::InetAddress(&this->address_,address);
  return;
}

Assistant:

Socket::Socket(const InetAddress& address):
		fd_(socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC | SOCK_NONBLOCK, 0)),
		address_(address)
{

}